

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall arangodb::velocypack::Parser::parseNumber(Parser *this)

{
  byte bVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  ulong uVar6;
  Exception *this_00;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  char *msg;
  uint8_t *puVar10;
  Builder *this_01;
  bool bVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined4 uVar15;
  ParsedNumber numberValue;
  ParsedNumber exponent;
  ParsedNumber local_68;
  undefined1 local_48 [16];
  ParsedNumber local_38;
  
  uVar2 = this->_pos;
  local_68.intValue = 0;
  local_68.doubleValue = 0.0;
  local_68.isInteger = true;
  uVar6 = this->_size;
  if (uVar6 <= uVar2) {
LAB_0010c260:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Expecting digit";
LAB_0010c28a:
    Exception::Exception(this_00,ParseError,msg);
LAB_0010c297:
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  uVar9 = uVar2 + 1;
  this->_pos = uVar9;
  bVar1 = this->_start[uVar2];
  bVar7 = bVar1;
  if (bVar1 == 0x2d) {
    if (uVar9 < uVar6) {
      uVar9 = uVar2 + 2;
      this->_pos = uVar9;
      bVar7 = this->_start[uVar2 + 1];
      goto LAB_0010bf5e;
    }
    goto LAB_0010c276;
  }
LAB_0010bf5e:
  if (bVar7 - 0x3a < 0xfffffff6) goto LAB_0010c260;
  if (bVar7 != 0x30) {
    this->_pos = uVar9 - 1;
    scanDigits(this,&local_68);
    uVar6 = this->_size;
    uVar9 = this->_pos;
  }
  uVar15 = (undefined4)(local_68.intValue >> 0x20);
  dVar13 = local_68.doubleValue;
  if (uVar9 < uVar6) {
    puVar10 = this->_start;
    uVar8 = uVar9 + 1;
    this->_pos = uVar8;
    bVar7 = puVar10[uVar9];
    if ((bVar7 & 0xdf) == 0x45 || bVar7 == 0x2e) {
      if (bVar7 == 0x2e) {
        if ((uVar6 <= uVar8) || (this->_pos = uVar9 + 2, puVar10[uVar9 + 1] - 0x3a < 0xfffffff6))
        goto LAB_0010c276;
        this->_pos = uVar8;
        dVar12 = scanDigitsFractional(this);
        if (local_68.isInteger == false) {
          dVar5 = 0.0;
          dVar13 = local_68.doubleValue;
        }
        else {
          dVar5 = (double)CONCAT44(0x43300000,(int)local_68.intValue) - 4503599627370496.0;
          dVar13 = (double)CONCAT44(0x45300000,(int)(local_68.intValue >> 0x20)) -
                   1.9342813113834067e+25;
          auVar3._8_4_ = SUB84(dVar13,0);
          auVar3._0_8_ = dVar5;
          auVar3._12_4_ = (int)((ulong)dVar13 >> 0x20);
          dVar13 = dVar5 + dVar13;
          dVar5 = dVar5 + auVar3._8_8_;
        }
        if (bVar1 == 0x2d) {
          dVar5 = -dVar5;
          dVar13 = -dVar13 - dVar12;
        }
        else {
          dVar13 = dVar13 + dVar12;
        }
        uVar6 = this->_size;
        uVar9 = this->_pos;
        if (uVar6 <= uVar9) {
          this_01 = this->_builderPtr;
          goto LAB_0010c250;
        }
        puVar10 = this->_start;
        uVar8 = uVar9 + 1;
        this->_pos = uVar8;
        bVar7 = puVar10[uVar9];
      }
      else {
        if (local_68.isInteger == false) {
          dVar5 = 0.0;
        }
        else {
          dVar5 = (double)CONCAT44(0x43300000,(int)local_68.intValue) - 4503599627370496.0;
          dVar13 = (double)CONCAT44(0x45300000,uVar15) - 1.9342813113834067e+25;
          auVar4._8_4_ = SUB84(dVar13,0);
          auVar4._0_8_ = dVar5;
          auVar4._12_4_ = (int)((ulong)dVar13 >> 0x20);
          dVar13 = dVar5 + dVar13;
          dVar5 = dVar5 + auVar4._8_8_;
        }
        if (bVar1 == 0x2d) {
          dVar13 = -dVar13;
          dVar5 = -dVar5;
        }
      }
      if ((bVar7 & 0xdf) != 0x45) {
        this->_pos = uVar8 - 1;
        this_01 = this->_builderPtr;
        dVar13 = atof((char *)(puVar10 + uVar2));
        goto LAB_0010c250;
      }
      if (uVar8 < uVar6) {
        uVar9 = uVar8 + 1;
        this->_pos = uVar9;
        bVar1 = puVar10[uVar8];
        bVar11 = bVar1 == 0x2d;
        if ((bVar11) || (bVar1 == 0x2b)) {
          if (uVar6 <= uVar9) goto LAB_0010c276;
          this->_pos = uVar8 + 2;
          bVar1 = puVar10[uVar8 + 1];
          uVar8 = uVar9;
        }
        else {
          bVar11 = false;
        }
        local_48._8_4_ = SUB84(dVar5,0);
        local_48._0_8_ = dVar13;
        local_48._12_4_ = (int)((ulong)dVar5 >> 0x20);
        if (0xfffffff5 < bVar1 - 0x3a) {
          this->_pos = uVar8;
          local_38.intValue = 0;
          local_38.doubleValue = 0.0;
          local_38.isInteger = true;
          scanDigits(this,&local_38);
          dVar13 = local_38.doubleValue;
          if (local_38.isInteger != false) {
            dVar13 = ((double)CONCAT44(0x43300000,(int)local_38.intValue) - 4503599627370496.0) +
                     ((double)CONCAT44(0x45300000,(int)(local_38.intValue >> 0x20)) -
                     1.9342813113834067e+25);
          }
          if (bVar11) {
            dVar13 = -dVar13;
          }
          dVar13 = pow(10.0,dVar13);
          if (0x7fefffffffffffff < (long)ABS((double)local_48._0_8_ * dVar13)) {
            this_00 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception(this_00,NumberOutOfRange);
            goto LAB_0010c297;
          }
          this_01 = this->_builderPtr;
          dVar13 = atof((char *)(this->_start + uVar2));
          goto LAB_0010c250;
        }
      }
LAB_0010c276:
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Incomplete number";
      goto LAB_0010c28a;
    }
    this->_pos = uVar9;
  }
  if (local_68.isInteger == false) {
    this_01 = this->_builderPtr;
    if (bVar1 != 0x2d) goto LAB_0010c250;
  }
  else {
    if (bVar1 != 0x2d) {
      Builder::addUInt(this->_builderPtr,local_68.intValue);
      return;
    }
    if (-1 < (long)local_68.intValue) {
      Builder::addInt(this->_builderPtr,-local_68.intValue);
      return;
    }
    this_01 = this->_builderPtr;
    auVar14._8_4_ = uVar15;
    auVar14._0_8_ = local_68.intValue;
    auVar14._12_4_ = 0x45300000;
    dVar13 = ((double)CONCAT44(0x43300000,(int)local_68.intValue) - 4503599627370496.0) +
             (auVar14._8_8_ - 1.9342813113834067e+25);
  }
  dVar13 = -dVar13;
LAB_0010c250:
  Builder::addDouble(this_01,dVar13);
  return;
}

Assistant:

void Parser::parseNumber() {
  std::size_t startPos = _pos;
  ParsedNumber numberValue;
  bool negative = false;
  int i = consume();
  // We know that a character is coming, and it's a number if it
  // starts with '-' or a digit. otherwise it's invalid
  if (i == '-') {
    i = getOneOrThrow("Incomplete number");
    negative = true;
  }
  if (i < '0' || i > '9') {
    throw Exception(Exception::ParseError, "Expecting digit");
  }

  if (i != '0') {
    unconsume();
    scanDigits(numberValue);
  }
  i = consume();
  if (i < 0 || (i != '.' && i != 'e' && i != 'E')) {
    if (i >= 0) {
      unconsume();
    }
    if (!numberValue.isInteger) {
      if (negative) {
        _builderPtr->addDouble(-numberValue.doubleValue);
      } else {
        _builderPtr->addDouble(numberValue.doubleValue);
      }
    } else if (negative) {
      if (numberValue.intValue <= static_cast<uint64_t>(INT64_MAX)) {
        _builderPtr->addInt(-static_cast<int64_t>(numberValue.intValue));
      } else if (numberValue.intValue == toUInt64(INT64_MIN)) {
        _builderPtr->addInt(INT64_MIN);
      } else {
        _builderPtr->addDouble(-static_cast<double>(numberValue.intValue));
      }
    } else {
      _builderPtr->addUInt(numberValue.intValue);
    }
    return;
  }

  double fractionalPart;
  if (i == '.') {
    // fraction. skip over '.'
    i = getOneOrThrow("Incomplete number");
    if (i < '0' || i > '9') {
      throw Exception(Exception::ParseError, "Incomplete number");
    }
    unconsume();
    fractionalPart = scanDigitsFractional();
    if (negative) {
      fractionalPart = -numberValue.asDouble() - fractionalPart;
    } else {
      fractionalPart = numberValue.asDouble() + fractionalPart;
    }
    i = consume();
    if (i < 0) {
      _builderPtr->addDouble(fractionalPart);
      return;
    }
  } else {
    if (negative) {
      fractionalPart = -numberValue.asDouble();
    } else {
      fractionalPart = numberValue.asDouble();
    }
  }
  if (i != 'e' && i != 'E') {
    unconsume();
    // use conventional atof() conversion here, to avoid precision loss
    // when interpreting and multiplying the single digits of the input stream
    // _builderPtr->addDouble(fractionalPart);
    _builderPtr->addDouble(
        atof(reinterpret_cast<char const*>(_start) + startPos));
    return;
  }
  i = getOneOrThrow("Incomplete number");
  negative = false;
  if (i == '+' || i == '-') {
    negative = (i == '-');
    i = getOneOrThrow("Incomplete number");
  }
  if (i < '0' || i > '9') {
    throw Exception(Exception::ParseError, "Incomplete number");
  }
  unconsume();
  ParsedNumber exponent;
  scanDigits(exponent);
  if (negative) {
    fractionalPart *= pow(10, -exponent.asDouble());
  } else {
    fractionalPart *= pow(10, exponent.asDouble());
  }
  if (std::isnan(fractionalPart) || !std::isfinite(fractionalPart)) {
    throw Exception(Exception::NumberOutOfRange);
  }
  // use conventional atof() conversion here, to avoid precision loss
  // when interpreting and multiplying the single digits of the input stream
  // _builderPtr->addDouble(fractionalPart);
  _builderPtr->addDouble(
      atof(reinterpret_cast<char const*>(_start) + startPos));
}